

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_disposition(DISPOSITION_HANDLE disposition)

{
  DISPOSITION_INSTANCE *disposition_instance;
  AMQP_VALUE result;
  DISPOSITION_HANDLE disposition_local;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    disposition_instance = (DISPOSITION_INSTANCE *)0x0;
  }
  else {
    disposition_instance = (DISPOSITION_INSTANCE *)amqpvalue_clone(disposition->composite_value);
  }
  return (AMQP_VALUE)disposition_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_disposition(DISPOSITION_HANDLE disposition)
{
    AMQP_VALUE result;

    if (disposition == NULL)
    {
        result = NULL;
    }
    else
    {
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        result = amqpvalue_clone(disposition_instance->composite_value);
    }

    return result;
}